

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_set_volume(cubeb_stream_conflict *stm,float volume)

{
  pa_volume_t pVar1;
  uint32_t uVar2;
  pa_sample_spec *stream;
  pa_operation *ppVar3;
  long *in_RDI;
  float in_XMM0_Da;
  cubeb_conflict *ctx;
  pa_sample_spec *ss;
  pa_cvolume cvol;
  pa_volume_t vol;
  pa_operation *op;
  uint32_t index;
  pa_operation *o;
  cubeb_conflict *in_stack_ffffffffffffff58;
  int local_4;
  
  if (in_RDI[2] == 0) {
    local_4 = -1;
  }
  else {
    (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
    o = (pa_operation *)*in_RDI;
    if ((*(long *)(o + 0x20) == 0) || ((*(uint *)(*(long *)(o + 0x20) + 0x88) & 0x40) == 0)) {
      stream = (*cubeb_pa_stream_get_sample_spec)((pa_stream *)in_RDI[2]);
      pVar1 = (*cubeb_pa_sw_volume_from_linear)((double)in_XMM0_Da);
      (*cubeb_pa_cvolume_set)((pa_cvolume *)&stack0xffffffffffffff58,(uint)stream->channels,pVar1);
      uVar2 = (*cubeb_pa_stream_get_index)((pa_stream *)in_RDI[2]);
      ppVar3 = (*cubeb_pa_context_set_sink_input_volume)
                         (*(pa_context **)(o + 0x18),uVar2,(pa_cvolume *)&stack0xffffffffffffff58,
                          volume_success,in_RDI);
      if (ppVar3 != (pa_operation *)0x0) {
        operation_wait(in_stack_ffffffffffffff58,(pa_stream *)stream,o);
        (*cubeb_pa_operation_unref)(ppVar3);
      }
    }
    else {
      *(float *)((long)in_RDI + 0x54) = in_XMM0_Da;
    }
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(o + 0x10));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
pulse_stream_set_volume(cubeb_stream * stm, float volume)
{
  uint32_t index;
  pa_operation * op;
  pa_volume_t vol;
  pa_cvolume cvol;
  const pa_sample_spec * ss;
  cubeb * ctx;

  if (!stm->output_stream) {
    return CUBEB_ERROR;
  }

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);

  /* if the pulse daemon is configured to use flat volumes,
   * apply our own gain instead of changing the input volume on the sink. */
  ctx = stm->context;
  if (ctx->default_sink_info &&
      (ctx->default_sink_info->flags & PA_SINK_FLAT_VOLUME)) {
    stm->volume = volume;
  } else {
    ss = WRAP(pa_stream_get_sample_spec)(stm->output_stream);

    vol = WRAP(pa_sw_volume_from_linear)(volume);
    WRAP(pa_cvolume_set)(&cvol, ss->channels, vol);

    index = WRAP(pa_stream_get_index)(stm->output_stream);

    op = WRAP(pa_context_set_sink_input_volume)(ctx->context,
                                                index, &cvol, volume_success,
                                                stm);
    if (op) {
      operation_wait(ctx, stm->output_stream, op);
      WRAP(pa_operation_unref)(op);
    }
  }

  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);

  return CUBEB_OK;
}